

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_GetArg::test_method(util_GetArg *this)

{
  long lVar1;
  initializer_list<UniValue> __l;
  initializer_list<UniValue> __l_00;
  initializer_list<UniValue> __l_01;
  initializer_list<UniValue> __l_02;
  initializer_list<UniValue> __l_03;
  initializer_list<UniValue> __l_04;
  initializer_list<UniValue> __l_05;
  initializer_list<UniValue> __l_06;
  initializer_list<UniValue> __l_07;
  initializer_list<UniValue> __l_08;
  initializer_list<UniValue> __l_09;
  initializer_list<UniValue> __l_10;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe6c8;
  char *in_stack_ffffffffffffe6d0;
  char *in_stack_ffffffffffffe6d8;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffe6e8;
  int in_stack_ffffffffffffe6ec;
  iterator in_stack_ffffffffffffe6f0;
  string *in_stack_ffffffffffffe6f8;
  string *in_stack_ffffffffffffe700;
  ArgsManager *in_stack_ffffffffffffe708;
  UniValue *in_stack_ffffffffffffe710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe718;
  undefined1 *local_1540;
  undefined1 *local_1500;
  undefined1 *local_14d0;
  undefined1 *local_1490;
  undefined1 *local_1460;
  undefined1 *local_1420;
  undefined1 *local_13f0;
  undefined1 *local_13c0;
  undefined1 *local_1390;
  undefined1 *local_1360;
  undefined1 *local_1330;
  _List *local_1300;
  util_GetArg *this_local;
  allocator<char> local_1182;
  allocator<char> local_1181;
  undefined1 local_1180 [16];
  undefined1 local_1170 [70];
  allocator<char> local_112a;
  allocator<char> local_1129;
  undefined1 local_1128 [16];
  undefined1 local_1118 [70];
  allocator<char> local_10d2;
  allocator<char> local_10d1;
  undefined1 local_10d0 [16];
  undefined1 local_10c0 [70];
  allocator<char> local_107a;
  allocator<char> local_1079;
  undefined1 local_1078 [16];
  undefined1 local_1068 [69];
  undefined1 local_1023 [2];
  undefined1 local_1021;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined8 local_1000;
  undefined1 local_fcb [2];
  undefined1 local_fc9;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [69];
  undefined1 local_f73 [2];
  undefined1 local_f71;
  undefined1 local_f70 [16];
  undefined1 local_f60 [69];
  undefined1 local_f1b [2];
  undefined1 local_f19;
  undefined1 local_f18 [16];
  undefined1 local_f08 [64];
  undefined1 local_ec8 [8];
  undefined8 local_ec0;
  undefined1 local_eb8 [16];
  undefined1 local_ea8 [64];
  undefined1 local_e68 [16];
  undefined8 local_e58;
  undefined1 local_e50 [16];
  undefined1 local_e40 [64];
  undefined1 local_e00 [8];
  undefined8 local_df8;
  undefined1 local_df0 [16];
  undefined1 local_de0 [70];
  allocator<char> local_d9a;
  allocator<char> local_d99;
  undefined1 local_d98 [16];
  undefined1 local_d88 [70];
  allocator<char> local_d42;
  allocator<char> local_d41;
  undefined1 local_d40 [16];
  undefined1 local_d30 [65];
  allocator<char> local_cef;
  allocator<char> local_cee;
  allocator<char> local_ced;
  allocator<char> local_cec;
  allocator<char> local_ceb;
  allocator<char> local_cea;
  allocator<char> local_ce9;
  allocator<char> local_ce8;
  allocator<char> local_ce7;
  allocator<char> local_ce6;
  allocator<char> local_ce5;
  allocator<char> local_ce4;
  allocator<char> local_ce3;
  allocator<char> local_ce2;
  allocator<char> local_ce1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  undefined1 local_c90 [96];
  undefined1 local_c30 [96];
  undefined1 local_bd0 [96];
  undefined1 local_b70 [320];
  undefined1 local_a30 [96];
  undefined1 local_9d0 [96];
  undefined1 local_970 [176];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [176];
  undefined1 local_7f0 [64];
  undefined1 local_7b0 [88];
  undefined1 local_758 [32];
  undefined1 local_738 [88];
  undefined1 local_6e0 [64];
  undefined1 local_6a0 [176];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [176];
  undefined1 local_520 [32];
  undefined1 local_500 [88];
  undefined1 local_4a8 [32];
  undefined1 local_488 [88];
  undefined1 local_430 [32];
  undefined1 local_410 [88];
  undefined1 local_3b8 [32];
  undefined1 local_398 [88];
  undefined1 local_340 [32];
  undefined1 local_320 [88];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [88];
  TestArgsManager testArgs;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_ffffffffffffe6c8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe6c8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe708,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe700,
             (char *)in_stack_ffffffffffffe6f8,(char *)in_stack_ffffffffffffe6f0,
             in_stack_ffffffffffffe6ec,SUB41((uint)in_stack_ffffffffffffe6e8 >> 0x18,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           *)in_stack_ffffffffffffe6c8);
  UniValue::UniValue<const_char_(&)[10],_char[10],_true>
            (in_stack_ffffffffffffe710,(char (*) [10])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce1);
  local_1300 = (_List *)&testArgs;
  do {
    local_1300 = local_1300 + -0xb;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1300 != (_List *)local_2a8);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>
            (in_stack_ffffffffffffe710,(char (*) [6])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_00._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_00._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce2);
  local_1330 = local_2c8;
  do {
    local_1330 = local_1330 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1330 != local_320);
  UniValue::UniValue<const_char_(&)[18],_char[18],_true>
            (in_stack_ffffffffffffe710,(char (*) [18])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_01._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_01._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce3);
  local_1360 = local_340;
  do {
    local_1360 = local_1360 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1360 != local_398);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            (in_stack_ffffffffffffe710,(char (*) [1])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_02._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_02._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_02);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce4);
  local_1390 = local_3b8;
  do {
    local_1390 = local_1390 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1390 != local_410);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_03._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_03._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_03);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce5);
  local_13c0 = local_430;
  do {
    local_13c0 = local_13c0 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_13c0 != local_488);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_04._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_04._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_04);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce6);
  local_13f0 = local_4a8;
  do {
    local_13f0 = local_13f0 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_13f0 != local_500);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_05._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_05._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_05);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce7);
  local_1420 = local_520;
  do {
    local_1420 = local_1420 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1420 != local_5d0);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_06._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_06._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_06);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ce8);
  local_1460 = local_5f0;
  do {
    local_1460 = local_1460 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1460 != local_6a0);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_07._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_07._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_07);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_cea);
  local_1490 = local_6e0;
  do {
    local_1490 = local_1490 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1490 != local_738);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_08._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_08._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_cec);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ceb);
  local_14d0 = local_758;
  do {
    local_14d0 = local_14d0 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_14d0 != local_7b0);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_09._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_09._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_09);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_ced);
  local_1500 = local_7f0;
  do {
    local_1500 = local_1500 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1500 != local_8a0);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffe710,(char (*) [2])in_stack_ffffffffffffe708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
             (allocator<char> *)in_stack_ffffffffffffe708);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_ffffffffffffe6f0,
               (key_type *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  __l_10._M_len = (size_type)in_stack_ffffffffffffe6f8;
  __l_10._M_array = in_stack_ffffffffffffe6f0;
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),__l_10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_cef);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6c8);
  std::allocator<char>::~allocator(&local_cee);
  local_1540 = local_8c0;
  do {
    local_1540 = local_1540 + -0x58;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6c8);
  } while (local_1540 != local_970);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    ArgsManager::GetArg(in_stack_ffffffffffffe708,in_stack_ffffffffffffe700,
                        in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe6d8 = "\"string...\"";
    in_stack_ffffffffffffe6d0 = "string...";
    in_stack_ffffffffffffe6c8 = "testArgs.GetArg(\"strtest1\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
              (local_d30,local_d40,0x273,1,2,local_9d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_d42);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_d41);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    ArgsManager::GetArg(in_stack_ffffffffffffe708,in_stack_ffffffffffffe700,
                        in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe6d8 = "\"default\"";
    in_stack_ffffffffffffe6d0 = "default";
    in_stack_ffffffffffffe6c8 = "testArgs.GetArg(\"strtest2\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_d88,local_d98,0x274,1,2,local_a30);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_d9a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_d99);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    local_df8 = ArgsManager::GetIntArg
                          ((ArgsManager *)in_stack_ffffffffffffe6d0,
                           (string *)in_stack_ffffffffffffe6c8,(int64_t)in_stack_ffffffffffffe6d8);
    local_e00._0_4_ = 0x3039;
    in_stack_ffffffffffffe6d8 = "12345";
    in_stack_ffffffffffffe6d0 = local_e00;
    in_stack_ffffffffffffe6c8 = "testArgs.GetIntArg(\"inttest1\", -1)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_de0,local_df0,0x275,1,2,&local_df8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_e00 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    local_e58 = ArgsManager::GetIntArg
                          ((ArgsManager *)in_stack_ffffffffffffe6d0,
                           (string *)in_stack_ffffffffffffe6c8,(int64_t)in_stack_ffffffffffffe6d8);
    local_e68._0_8_ = 0x123456789abcdef;
    in_stack_ffffffffffffe6d8 = "81985529216486895LL";
    in_stack_ffffffffffffe6d0 = local_e68;
    in_stack_ffffffffffffe6c8 = "testArgs.GetIntArg(\"inttest2\", -1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_e40,local_e50,0x276,1,2,&local_e58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_e68 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    local_ec0 = ArgsManager::GetIntArg
                          ((ArgsManager *)in_stack_ffffffffffffe6d0,
                           (string *)in_stack_ffffffffffffe6c8,(int64_t)in_stack_ffffffffffffe6d8);
    local_ec8._0_4_ = -1;
    in_stack_ffffffffffffe6d8 = "-1";
    in_stack_ffffffffffffe6d0 = local_ec8;
    in_stack_ffffffffffffe6c8 = "testArgs.GetIntArg(\"inttest3\", -1)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_ea8,local_eb8,0x277,1,2,&local_ec0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_ec8 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffe6d8 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    local_f19 = ArgsManager::GetBoolArg
                          ((ArgsManager *)in_stack_ffffffffffffe6d0,
                           (string *)in_stack_ffffffffffffe6c8,(bool)uVar3);
    local_f1b[0] = '\x01';
    in_stack_ffffffffffffe6d8 = "true";
    in_stack_ffffffffffffe6d0 = local_f1b;
    in_stack_ffffffffffffe6c8 = "testArgs.GetBoolArg(\"booltest1\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_f08,local_f18,0x278,1,2,&local_f19);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_f1b + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffe6d8 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    local_f71 = ArgsManager::GetBoolArg
                          ((ArgsManager *)in_stack_ffffffffffffe6d0,
                           (string *)in_stack_ffffffffffffe6c8,(bool)uVar3);
    local_f73[0] = '\0';
    in_stack_ffffffffffffe6d8 = "false";
    in_stack_ffffffffffffe6d0 = local_f73;
    in_stack_ffffffffffffe6c8 = "testArgs.GetBoolArg(\"booltest2\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_f60,local_f70,0x279,1,2,&local_f71);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_f73 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffe6d8 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    local_fc9 = ArgsManager::GetBoolArg
                          ((ArgsManager *)in_stack_ffffffffffffe6d0,
                           (string *)in_stack_ffffffffffffe6c8,(bool)uVar3);
    local_fcb[0] = '\0';
    in_stack_ffffffffffffe6d8 = "false";
    in_stack_ffffffffffffe6d0 = local_fcb;
    in_stack_ffffffffffffe6c8 = "testArgs.GetBoolArg(\"booltest3\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_fb8,local_fc8,0x27a,1,2,&local_fc9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_fcb + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffe6d8 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    local_1021 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffe6d0,
                            (string *)in_stack_ffffffffffffe6c8,(bool)uVar3);
    local_1023[0] = '\x01';
    in_stack_ffffffffffffe6d8 = "true";
    in_stack_ffffffffffffe6d0 = local_1023;
    in_stack_ffffffffffffe6c8 = "testArgs.GetBoolArg(\"booltest4\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1010,local_1020,0x27b,1,2,&local_1021);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1023 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    ArgsManager::GetArg(in_stack_ffffffffffffe708,in_stack_ffffffffffffe700,
                        in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe6d8 = "\"b\"";
    in_stack_ffffffffffffe6d0 = "b";
    in_stack_ffffffffffffe6c8 = "testArgs.GetArg(\"pritest1\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_1068,local_1078,0x27d,1,2,local_b70);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_107a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_1079);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    ArgsManager::GetArg(in_stack_ffffffffffffe708,in_stack_ffffffffffffe700,
                        in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe6d8 = "\"a\"";
    in_stack_ffffffffffffe6d0 = "a";
    in_stack_ffffffffffffe6c8 = "testArgs.GetArg(\"pritest2\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_10c0,local_10d0,0x27e,1,2,local_bd0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_10d2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_10d1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    ArgsManager::GetArg(in_stack_ffffffffffffe708,in_stack_ffffffffffffe700,
                        in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe6d8 = "\"a\"";
    in_stack_ffffffffffffe6d0 = "a";
    in_stack_ffffffffffffe6c8 = "testArgs.GetArg(\"pritest3\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_1118,local_1128,0x27f,1,2,local_c30);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_112a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_1129);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe708,
               (const_string *)in_stack_ffffffffffffe700,(size_t)in_stack_ffffffffffffe6f8,
               (const_string *)in_stack_ffffffffffffe6f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6d0,(char (*) [1])in_stack_ffffffffffffe6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,
               (unsigned_long)in_stack_ffffffffffffe6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe718,(char *)in_stack_ffffffffffffe710,
               (allocator<char> *)in_stack_ffffffffffffe708);
    ArgsManager::GetArg(in_stack_ffffffffffffe708,in_stack_ffffffffffffe700,
                        in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe6d8 = "\"b\"";
    in_stack_ffffffffffffe6d0 = "b";
    in_stack_ffffffffffffe6c8 = "testArgs.GetArg(\"pritest4\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_1170,local_1180,0x280,1,2,local_c90);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_1182);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6c8);
    std::allocator<char>::~allocator(&local_1181);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe6c8);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_ffffffffffffe6c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetArg)
{
    TestArgsManager testArgs;
    LOCK(testArgs.cs_args);
    testArgs.m_settings.command_line_options.clear();
    testArgs.m_settings.command_line_options["strtest1"] = {"string..."};
    // strtest2 undefined on purpose
    testArgs.m_settings.command_line_options["inttest1"] = {"12345"};
    testArgs.m_settings.command_line_options["inttest2"] = {"81985529216486895"};
    // inttest3 undefined on purpose
    testArgs.m_settings.command_line_options["booltest1"] = {""};
    // booltest2 undefined on purpose
    testArgs.m_settings.command_line_options["booltest3"] = {"0"};
    testArgs.m_settings.command_line_options["booltest4"] = {"1"};

    // priorities
    testArgs.m_settings.command_line_options["pritest1"] = {"a", "b"};
    testArgs.m_settings.ro_config[""]["pritest2"] = {"a", "b"};
    testArgs.m_settings.command_line_options["pritest3"] = {"a"};
    testArgs.m_settings.ro_config[""]["pritest3"] = {"b"};
    testArgs.m_settings.command_line_options["pritest4"] = {"a","b"};
    testArgs.m_settings.ro_config[""]["pritest4"] = {"c","d"};

    BOOST_CHECK_EQUAL(testArgs.GetArg("strtest1", "default"), "string...");
    BOOST_CHECK_EQUAL(testArgs.GetArg("strtest2", "default"), "default");
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest1", -1), 12345);
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest2", -1), 81985529216486895LL);
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest3", -1), -1);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest1", false), true);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest2", false), false);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest3", false), false);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest4", false), true);

    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest1", "default"), "b");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest2", "default"), "a");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest3", "default"), "a");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest4", "default"), "b");
}